

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_writer.cpp
# Opt level: O0

String * __thiscall Json::toHex16Bit_abi_cxx11_(String *__return_storage_ptr__,Json *this,uint x)

{
  undefined1 uVar1;
  undefined1 *puVar2;
  allocator local_1e;
  undefined1 local_1d;
  uint local_1c;
  uint local_18;
  uint lo;
  uint hi;
  uint x_local;
  String *result;
  
  lo._1_1_ = (byte)((ulong)this >> 8);
  local_18 = (uint)lo._1_1_;
  local_1c = (uint)this & 0xff;
  local_1d = 0;
  lo = (uint)this;
  _hi = __return_storage_ptr__;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)__return_storage_ptr__,4,' ',&local_1e);
  std::allocator<char>::~allocator((allocator<char> *)&local_1e);
  uVar1 = hex2[local_18 * 2];
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *puVar2 = uVar1;
  uVar1 = hex2[(ulong)(local_18 * 2) + 1];
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *puVar2 = uVar1;
  uVar1 = hex2[local_1c * 2];
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *puVar2 = uVar1;
  uVar1 = hex2[(ulong)(local_1c * 2) + 1];
  puVar2 = (undefined1 *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  *puVar2 = uVar1;
  return __return_storage_ptr__;
}

Assistant:

static String toHex16Bit(unsigned int x) {
  const unsigned int hi = (x >> 8) & 0xff;
  const unsigned int lo = x & 0xff;
  String result(4, ' ');
  result[0] = hex2[2 * hi];
  result[1] = hex2[2 * hi + 1];
  result[2] = hex2[2 * lo];
  result[3] = hex2[2 * lo + 1];
  return result;
}